

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall HPresolve::getDualsSingletonRow(HPresolve *this,int row,int col)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  reference pvVar5;
  reference pvVar6;
  type *ptVar7;
  ostream *poVar8;
  reference pvVar9;
  int in_ESI;
  int iVar10;
  long in_RDI;
  double dVar11;
  double dVar12;
  double extraout_XMM0_Qa;
  double dVar13;
  double in_stack_00000188;
  double in_stack_00000190;
  double in_stack_00000198;
  int in_stack_000001a4;
  int in_stack_000001a8;
  int in_stack_000001ac;
  KktChStep *in_stack_000001b0;
  double newz;
  int k_1;
  double up;
  double lo;
  double upZ;
  double loZ;
  double upY;
  double loY;
  double y;
  int k;
  double sum;
  double urow;
  double lrow;
  double u;
  double l;
  double aij;
  double cost;
  pair<int,_std::vector<double,_std::allocator<double>_>_> bnd;
  pair<int,_std::vector<double,_std::allocator<double>_>_> *in_stack_fffffffffffffc98;
  pair<int,_std::vector<double,_std::allocator<double>_>_> *in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffca8;
  KktChStep *in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffcb8;
  HPreData *in_stack_fffffffffffffcc0;
  int local_bc;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  int local_7c;
  double local_78;
  
  std::
  stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::top((stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
         *)0x1aa6b1);
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::pair
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  std::
  stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::pop((stack<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::deque<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>_>
         *)0x1aa6ce);
  pvVar5 = std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                      (size_type)in_stack_fffffffffffffc98);
  *pvVar5 = 0.0;
  pvVar6 = std::stack<double,_std::deque<double,_std::allocator<double>_>_>::top
                     ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)0x1aa719);
  dVar1 = *pvVar6;
  std::stack<double,_std::deque<double,_std::allocator<double>_>_>::pop
            ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)0x1aa74c);
  dVar11 = HPreData::getaij(in_stack_fffffffffffffcc0,
                            (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                            (int)in_stack_fffffffffffffcb8);
  ptVar7 = std::get<1ul,int,std::vector<double,std::allocator<double>>>
                     ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x1aa79b);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](ptVar7,0);
  dVar13 = *pvVar5;
  ptVar7 = std::get<1ul,int,std::vector<double,std::allocator<double>>>
                     ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x1aa7c1);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](ptVar7,1);
  dVar2 = *pvVar5;
  ptVar7 = std::get<1ul,int,std::vector<double,std::allocator<double>>>
                     ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x1aa7e8);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](ptVar7,2);
  dVar3 = *pvVar5;
  ptVar7 = std::get<1ul,int,std::vector<double,std::allocator<double>>>
                     ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x1aa80f);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](ptVar7,3);
  dVar4 = *pvVar5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::at
                     ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                      (size_type)in_stack_fffffffffffffc98);
  dVar12 = dVar11 * *pvVar5 + -dVar3;
  if ((dVar12 < *(double *)(in_RDI + 0xae8) || dVar12 == *(double *)(in_RDI + 0xae8)) ||
     (pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                          (size_type)in_stack_fffffffffffffc98), dVar12 = -dVar11 * *pvVar5 + dVar4,
     dVar12 < *(double *)(in_RDI + 0xae8) || dVar12 == *(double *)(in_RDI + 0xae8))) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                        (size_type)in_stack_fffffffffffffc98);
    if ((*pvVar5 <= dVar13) ||
       (pvVar5 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                            (size_type)in_stack_fffffffffffffc98), dVar2 <= *pvVar5)) {
LAB_001aaa72:
      pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                          (size_type)in_stack_fffffffffffffc98);
      if ((((*pvVar5 == dVar13) && (!NAN(*pvVar5) && !NAN(dVar13))) &&
          (pvVar5 = std::vector<double,_std::allocator<double>_>::at
                              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                               (size_type)in_stack_fffffffffffffc98), *pvVar5 < dVar2)) &&
         (pvVar5 = std::vector<double,_std::allocator<double>_>::at
                             ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                              (size_type)in_stack_fffffffffffffc98),
         *pvVar5 < -*(double *)(in_RDI + 0xae8))) goto LAB_001aac25;
      pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                          (size_type)in_stack_fffffffffffffc98);
      if (((*pvVar5 == dVar2) && (!NAN(*pvVar5) && !NAN(dVar2))) &&
         ((pvVar5 = std::vector<double,_std::allocator<double>_>::at
                              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                               (size_type)in_stack_fffffffffffffc98), dVar13 < *pvVar5 &&
          (pvVar5 = std::vector<double,_std::allocator<double>_>::at
                              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                               (size_type)in_stack_fffffffffffffc98),
          *(double *)(in_RDI + 0xae8) <= *pvVar5 && *pvVar5 != *(double *)(in_RDI + 0xae8)))))
      goto LAB_001aac25;
    }
    else {
      iVar10 = (int)in_RDI + 0x1c8;
      std::vector<double,_std::allocator<double>_>::at
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                 (size_type)in_stack_fffffffffffffc98);
      std::abs(iVar10);
      if (extraout_XMM0_Qa < *(double *)(in_RDI + 0xae8) ||
          extraout_XMM0_Qa == *(double *)(in_RDI + 0xae8)) goto LAB_001aaa72;
LAB_001aac25:
      pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                          (size_type)in_stack_fffffffffffffc98);
      *pvVar5 = 0.0;
    }
    local_78 = 0.0;
    pvVar9 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                        (size_type)in_stack_fffffffffffffc98);
    local_7c = *pvVar9;
    while( true ) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                          (size_type)in_stack_fffffffffffffc98);
      iVar10 = (int)((ulong)in_stack_fffffffffffffca8 >> 0x20);
      if (*pvVar9 <= local_7c) break;
      std::vector<int,_std::allocator<int>_>::at
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                 (size_type)in_stack_fffffffffffffc98);
      pvVar9 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                          (size_type)in_stack_fffffffffffffc98);
      if (*pvVar9 != 0) {
        std::vector<int,_std::allocator<int>_>::at
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                   (size_type)in_stack_fffffffffffffc98);
        pvVar5 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                            (size_type)in_stack_fffffffffffffc98);
        dVar12 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                            (size_type)in_stack_fffffffffffffc98);
        local_78 = dVar12 * *pvVar5 + local_78;
      }
      local_7c = local_7c + 1;
    }
    pvVar9 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                        (size_type)in_stack_fffffffffffffc98);
    *pvVar9 = 1;
    pvVar5 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                        (size_type)in_stack_fffffffffffffc98);
    dVar12 = ((*pvVar5 - dVar1) - local_78) / dVar11;
    if ((dVar12 != 0.0) || (NAN(dVar12))) {
      if (*(int *)(in_RDI + 0x7cc) == 1) {
        KktChStep::addCost(in_stack_fffffffffffffcb0,iVar10,(double)in_stack_fffffffffffffca0);
      }
      if ((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                            (size_type)in_stack_fffffffffffffc98);
        if ((dVar11 * *pvVar5 != dVar3) ||
           ((NAN(dVar11 * *pvVar5) || NAN(dVar3) ||
            (dVar12 < *(double *)(in_RDI + 0xae8) || dVar12 == *(double *)(in_RDI + 0xae8))))) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::at
                             ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                              (size_type)in_stack_fffffffffffffc98);
          if ((dVar11 * *pvVar5 != dVar4) ||
             ((NAN(dVar11 * *pvVar5) || NAN(dVar4) || (-*(double *)(in_RDI + 0xae8) <= dVar12))))
          goto LAB_001abb44;
        }
        local_90 = -1e+200;
        local_98 = 1e+200;
        if (dVar12 < *(double *)(in_RDI + 0xae8) || dVar12 == *(double *)(in_RDI + 0xae8)) {
          local_90 = 0.0;
        }
        else {
          local_98 = 0.0;
        }
        local_a0 = -1e+200;
        local_a8 = 1e+200;
        pvVar5 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                            (size_type)in_stack_fffffffffffffc98);
        if ((*pvVar5 != dVar13) || (dVar2 <= dVar13)) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::at
                             ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                              (size_type)in_stack_fffffffffffffc98);
          if ((*pvVar5 != dVar2) || (dVar2 <= dVar13)) {
            if ((dVar13 == dVar2) && (!NAN(dVar13) && !NAN(dVar2))) {
              local_a0 = 0.0;
              local_a8 = 0.0;
            }
          }
          else {
            local_a8 = 0.0;
          }
        }
        else {
          local_a0 = 0.0;
        }
        if (dVar11 <= 0.0) {
          if (dVar11 < 0.0) {
            if ((-1e+200 < local_90) &&
               (dVar13 = dVar11 * local_90 + local_78 + dVar1, dVar13 < local_a8)) {
              local_a8 = dVar13;
            }
            if ((local_98 < 1e+200) &&
               (dVar13 = dVar11 * local_98 + local_78 + dVar1, local_a0 < dVar13)) {
              local_a0 = dVar13;
            }
          }
        }
        else {
          if ((-1e+200 < local_90) &&
             (dVar13 = dVar11 * local_90 + local_78 + dVar1, local_a0 < dVar13)) {
            local_a0 = dVar13;
          }
          if ((local_98 < 1e+200) &&
             (dVar13 = dVar11 * local_98 + local_78 + dVar1, dVar13 < local_a8)) {
            local_a8 = dVar13;
          }
        }
        if (dVar11 <= 0.0) {
          if (dVar11 < 0.0) {
            if ((-1e+200 < local_a0) &&
               (dVar13 = ((local_a0 - local_78) - dVar1) / dVar11, dVar13 < local_98)) {
              local_98 = dVar13;
            }
            if ((local_a8 < 1e+200) &&
               (dVar13 = ((local_a0 - local_78) - dVar1) / dVar11, local_90 < dVar13)) {
              local_90 = dVar13;
            }
          }
        }
        else {
          if ((-1e+200 < local_a0) &&
             (dVar13 = ((local_a0 - local_78) - dVar1) / dVar11, local_90 < dVar13)) {
            local_90 = dVar13;
          }
          if ((local_a8 < 1e+200) &&
             (dVar13 = ((local_a8 - local_78) - dVar1) / dVar11, dVar13 < local_98)) {
            local_98 = dVar13;
          }
        }
        poVar8 = std::operator<<((ostream *)&std::cout,"loY= ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_90);
        poVar8 = std::operator<<(poVar8," upY= ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_98);
        poVar8 = std::operator<<(poVar8,"loZ= ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_a0);
        poVar8 = std::operator<<(poVar8," upZ= ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_a8);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        pvVar5 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                            (size_type)in_stack_fffffffffffffc98);
        *pvVar5 = 0.0;
        local_78 = 0.0;
        pvVar9 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                            (size_type)in_stack_fffffffffffffc98);
        for (local_bc = *pvVar9;
            pvVar9 = std::vector<int,_std::allocator<int>_>::at
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                                (size_type)in_stack_fffffffffffffc98), local_bc < *pvVar9;
            local_bc = local_bc + 1) {
          std::vector<int,_std::allocator<int>_>::at
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                     (size_type)in_stack_fffffffffffffc98);
          pvVar9 = std::vector<int,_std::allocator<int>_>::at
                             ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                              (size_type)in_stack_fffffffffffffc98);
          if (*pvVar9 != 0) {
            std::vector<int,_std::allocator<int>_>::at
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                       (size_type)in_stack_fffffffffffffc98);
            pvVar5 = std::vector<double,_std::allocator<double>_>::at
                               ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0
                                ,(size_type)in_stack_fffffffffffffc98);
            dVar13 = *pvVar5;
            pvVar5 = std::vector<double,_std::allocator<double>_>::at
                               ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0
                                ,(size_type)in_stack_fffffffffffffc98);
            local_78 = dVar13 * *pvVar5 + local_78;
          }
        }
        dVar13 = dVar1 + local_78;
        pvVar5 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                            (size_type)in_stack_fffffffffffffc98);
        if (((0.0 < *pvVar5) && (dVar13 < 0.0)) ||
           ((pvVar5 = std::vector<double,_std::allocator<double>_>::at
                                ((vector<double,_std::allocator<double>_> *)
                                 in_stack_fffffffffffffca0,(size_type)in_stack_fffffffffffffc98),
            *pvVar5 <= 0.0 && *pvVar5 != 0.0 && (0.0 < dVar13)))) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::at
                             ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                              (size_type)in_stack_fffffffffffffc98);
          *pvVar5 = (-dVar1 - local_78) / dVar11;
          pvVar5 = std::vector<double,_std::allocator<double>_>::at
                             ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                              (size_type)in_stack_fffffffffffffc98);
          *pvVar5 = 0.0;
          if (*(int *)(in_RDI + 0x7cc) == 1) {
            std::vector<double,_std::allocator<double>_>::at
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                       (size_type)in_stack_fffffffffffffc98);
            std::vector<double,_std::allocator<double>_>::at
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                       (size_type)in_stack_fffffffffffffc98);
            KktChStep::addChange
                      (in_stack_000001b0,in_stack_000001ac,in_stack_000001a8,in_stack_000001a4,
                       in_stack_00000198,in_stack_00000190,in_stack_00000188);
          }
        }
        else {
          pvVar5 = std::vector<double,_std::allocator<double>_>::at
                             ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                              (size_type)in_stack_fffffffffffffc98);
          *pvVar5 = dVar13;
        }
        goto LAB_001abd47;
      }
LAB_001abb44:
      pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                          (size_type)in_stack_fffffffffffffc98);
      *pvVar5 = dVar12;
    }
  }
  else {
    pvVar5 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                        (size_type)in_stack_fffffffffffffc98);
    *pvVar5 = 0.0;
  }
  pvVar9 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                      (size_type)in_stack_fffffffffffffc98);
  *pvVar9 = 1;
  pvVar9 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                      (size_type)in_stack_fffffffffffffc98);
  if (*pvVar9 == 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                        (size_type)in_stack_fffffffffffffc98);
    if ((*pvVar5 != dVar13) || (NAN(*pvVar5) || NAN(dVar13))) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                          (size_type)in_stack_fffffffffffffc98);
      if ((*pvVar5 != dVar2) || (NAN(*pvVar5) || NAN(dVar2))) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                            (size_type)in_stack_fffffffffffffc98);
        *pvVar9 = 0;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),
                            (long)(*(int *)(in_RDI + 0xc) + in_ESI));
        *pvVar9 = 1;
        goto LAB_001abd47;
      }
    }
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),
                        (long)(*(int *)(in_RDI + 0xc) + in_ESI));
    *pvVar9 = 0;
  }
  else {
    pvVar9 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                        (size_type)in_stack_fffffffffffffc98);
    if (*pvVar9 == 0) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),
                          (long)(*(int *)(in_RDI + 0xc) + in_ESI));
      *pvVar9 = 0;
    }
  }
LAB_001abd47:
  std::pair<int,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<int,_std::vector<double,_std::allocator<double>_>_> *)0x1abd54);
  return;
}

Assistant:

void HPresolve::getDualsSingletonRow( int row, int col ) {

	pair< int ,vector<double> > bnd = oldBounds.top(); oldBounds.pop();

	valueRowDual.at(row) = 0;
	double cost = postValue.top(); postValue.pop();
	double aij = getaij(row, col);
	double l = (get<1>(bnd))[0];
	double u = (get<1>(bnd))[1];
	double lrow = (get<1>(bnd))[2];
	double urow = (get<1>(bnd))[3];
	if ((aij*valuePrimal.at(col) - lrow) > tol && ( -aij*valuePrimal.at(col) + urow) > tol) {
		valueRowDual.at(row) = 0;
		//row is nonbasic

	}
	else {
		if  ((valuePrimal.at(col) > l && valuePrimal.at(col) < u && abs(valueColDual.at(col)) > tol ) ||
				(valuePrimal.at(col) == l && valuePrimal.at(col) < u && valueColDual.at(col) < -tol ) ||
				(valuePrimal.at(col) == u && valuePrimal.at(col) > l && valueColDual.at(col) > tol )) {

			valueColDual.at(col) = 0;
		}

		double sum = 0;
		for (int k=Astart.at(col); k<Aend.at(col);++k )
			if (flagRow.at(Aindex.at(k)))
				sum = sum + valueRowDual.at(Aindex.at(k))*Avalue.at(k);

		flagRow.at(row) = 1;


		double y = (valueColDual.at(col) - cost - sum)/aij;
		if (y != 0) {
			if (iKKTcheck == 1)
				chk.addCost(col, cost);

			//aij * yi + sum + ci = zi
			if (urow != lrow)
				if  ((aij*valuePrimal.at(col) == lrow && y >  tol) ||
					(aij*valuePrimal.at(col) == urow && y < -tol)) {


					//bounds on y_row
					double loY = -HSOL_CONST_INF;
					double upY = HSOL_CONST_INF;

					if (y>tol)
						upY = 0;
					else //y < -tol
						loY = 0;

					//bounds on z_col
					double loZ = -HSOL_CONST_INF;
					double upZ = HSOL_CONST_INF;
					if  (valuePrimal.at(col) == l && l < u ) {
						loZ = 0;
					}
					else if (valuePrimal.at(col) == u && l < u) {
						upZ = 0;
					}
					else if (l==u) {
						loZ = 0;
						upZ = 0;
					}
					//aij * yi + sum + ci = zi

					double lo = -HSOL_CONST_INF;
					double up = HSOL_CONST_INF;
					//bounds on z by y
					if (aij > 0) {
						if (loY >  -HSOL_CONST_INF) {
							lo = sum + cost + aij * loY;
							if (lo>loZ)
								loZ = lo;
						}
						if (upY < HSOL_CONST_INF) {
							up = sum + cost + aij * upY;
							if (up<upZ)
								upZ = up;
						}
					}
					else if (aij < 0) {
						if (loY >  -HSOL_CONST_INF) {
							up = sum + cost + aij * loY;
							if (up<upZ)
								upZ = up;
						}
						if (upY < HSOL_CONST_INF) {
							lo = sum + cost + aij * upY;
							if (lo>loZ)
								loZ = lo;
						}
					}
					//bounds on y by z
					//aij * yi  = zi - sum - ci
					if (aij > 0) {
						if (loZ >  -HSOL_CONST_INF) {
							lo = (loZ - sum - cost )/aij;
							if (lo>loY)
								loY = lo;
						}
						if (upZ < HSOL_CONST_INF) {
							up = (upZ - sum - cost )/aij;
							if (up<upY)
								upY = up;
						}
					}
					else if (aij < 0) {
						if (loZ >  -HSOL_CONST_INF) {
							up = (loZ - sum - cost )/aij;
							if (up<upY)
								upY = up;
						}
						if (upZ < HSOL_CONST_INF) {
							lo = (loZ - sum - cost )/aij;
							if (lo>loY)
								loY = lo;
						}
					}

					cout<< "loY= "<< loY <<" upY= "<<upY<<"loZ= "<< loZ <<" upZ= "<<upZ<<endl;

					valueRowDual.at(row) = 0;

					sum = 0;
					for (int k=Astart.at(col); k<Aend.at(col);++k )
						if (flagRow.at(Aindex.at(k))) {
							sum = sum + valueRowDual.at(Aindex.at(k))*Avalue.at(k);
							//cout<<" row "<<Aindex.at(k)<<" dual "<<valueRowDual.at(Aindex.at(k))<<" a_"<<Aindex.at(k)<<"_"<<j<<"\n";
						}
					double newz = cost + sum;
					if ((valueColDual.at(col) > 0 && newz < 0) ||
						(valueColDual.at(col) < 0 && newz > 0)) {
						//valueColDual.at(col) = 0;
						//update valueRowDual.at(row)
						//newz = 0 if cost + sum + aijyi = 0 so aijyi = - cost - sum

						valueRowDual.at(row) = (-cost - sum)/aij;
						valueColDual.at(col) = 0;
						if (iKKTcheck == 1) {
							chk.addChange(2, 0, col, valuePrimal.at(col), valueColDual.at(col), cost);
						}
						return;

					}

					valueColDual.at(col) = newz;
					return;
				}
		valueRowDual.at(row) = y;
		}
	}

	flagRow.at(row) = 1;
	//row is introduced so something needs to become basic :



	//check if x is at a bound forced by the singleton row: then x becomes basic and row nonbasic
	if (nonbasicFlag.at(col) == 1) {
		// x was not basic but is now
		if (valuePrimal.at(col)  != l && valuePrimal.at(col) != u ) {
			nonbasicFlag.at(col) = 0;
			nonbasicFlag[numColOriginal + row] = 1;
		}
		// x was not basic and is not now either, row is basic
		else
			nonbasicFlag[numColOriginal + row] = 0;
	}
	else if (nonbasicFlag.at(col) == 0)  // x is basic
		nonbasicFlag[numColOriginal + row] = 0; //row becomes basic too

}